

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBFArrayBox.cpp
# Opt level: O2

Array<const_FArrayBox_*,_3> * __thiscall
amrex::EBFArrayBox::getAreaFracData
          (Array<const_FArrayBox_*,_3> *__return_storage_ptr__,EBFArrayBox *this)

{
  bool bVar1;
  FArrayBox *pFVar2;
  Array<const_MultiCutFab_*,_3> local_30;
  
  if ((this->m_factory != (EBFArrayBoxFactory *)0x0) && (-1 < this->m_box_index)) {
    EBFArrayBoxFactory::getAreaFrac(&local_30,this->m_factory);
    bVar1 = MultiCutFab::ok(local_30._M_elems[0],this->m_box_index);
    if (bVar1) {
      pFVar2 = &MultiCutFab::operator[](local_30._M_elems[0],this->m_box_index)->super_FArrayBox;
      __return_storage_ptr__->_M_elems[0] = pFVar2;
      pFVar2 = &MultiCutFab::operator[](local_30._M_elems[1],this->m_box_index)->super_FArrayBox;
      __return_storage_ptr__->_M_elems[1] = pFVar2;
      pFVar2 = &MultiCutFab::operator[](local_30._M_elems[2],this->m_box_index)->super_FArrayBox;
      __return_storage_ptr__->_M_elems[2] = pFVar2;
      return __return_storage_ptr__;
    }
  }
  __return_storage_ptr__->_M_elems[0] = (FArrayBox *)0x0;
  __return_storage_ptr__->_M_elems[1] = (FArrayBox *)0x0;
  __return_storage_ptr__->_M_elems[2] = (FArrayBox *)0x0;
  return __return_storage_ptr__;
}

Assistant:

Array<const FArrayBox*, AMREX_SPACEDIM>
EBFArrayBox::getAreaFracData () const
{
    if (m_factory && m_box_index >= 0) {
        Array<MultiCutFab const*, AMREX_SPACEDIM> const& mfs = m_factory->getAreaFrac();
        if (mfs[0]->ok(m_box_index)) {
            return {AMREX_D_DECL(&((*mfs[0])[m_box_index]),
                                 &((*mfs[1])[m_box_index]),
                                 &((*mfs[2])[m_box_index]))};
        } else {
            return {AMREX_D_DECL(nullptr,nullptr,nullptr)};
        }
    } else {
        return {AMREX_D_DECL(nullptr,nullptr,nullptr)};
    }
}